

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O0

void __thiscall
HighsCliqueTable::extractCliquesFromCut
          (HighsCliqueTable *this,HighsMipSolver *mipsolver,HighsInt *inds,double *vals,HighsInt len
          ,double rhs)

{
  int iVar1;
  anon_class_16_2_0183c0cc __pred;
  anon_class_16_2_cb98ba35 __pred_00;
  HighsInt **ppHVar2;
  Reason RVar3;
  bool bVar4;
  HighsVarType HVar5;
  HighsInt HVar6;
  pointer pHVar7;
  reference pvVar8;
  difference_type dVar9;
  reference pvVar10;
  int *piVar11;
  iterator this_00;
  iterator mipsolver_00;
  reference piVar12;
  size_type sVar13;
  HighsInt **in_RCX;
  Reason in_RDX;
  HighsCDouble *in_RSI;
  HighsCliqueTable *in_RDI;
  vector<int,_std::allocator<int>_> *pvVar14;
  int in_R8D;
  pointer pdVar15;
  double dVar16;
  double dVar17;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  HighsCDouble HVar18;
  HighsInt pos;
  iterator j_1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> cliqueend;
  double mincliqueval;
  HighsInt k;
  HighsInt maxNewEntries;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> clique;
  double constant_1;
  double coef_1;
  double implcollb;
  double constant;
  double coef;
  double implcolub;
  HighsInt col;
  HighsInt j;
  HighsCDouble impliedActivity;
  HighsInt bincol;
  HighsInt i_2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> binaryend;
  vector<int,_std::allocator<int>_> perm;
  double boundVal;
  HighsInt i_1;
  HighsInt i;
  HighsInt nbin;
  HighsCDouble minact;
  double feastol;
  HighsDomain *globaldom;
  HighsImplications *implics;
  undefined4 in_stack_fffffffffffffae8;
  HighsInt in_stack_fffffffffffffaec;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffaf0;
  HighsCDouble *in_stack_fffffffffffffaf8;
  anon_class_8_1_8992ca70 in_stack_fffffffffffffb00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffb08;
  Reason in_stack_fffffffffffffb10;
  HighsInt **in_stack_fffffffffffffb18;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffb20;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var19;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffb28;
  double in_stack_fffffffffffffb58;
  double in_stack_fffffffffffffb60;
  undefined8 in_stack_fffffffffffffb68;
  HighsImplications *in_stack_fffffffffffffb70;
  HighsInt in_stack_fffffffffffffd84;
  undefined4 in_stack_fffffffffffffd88;
  HighsInt in_stack_fffffffffffffd8c;
  undefined4 in_stack_fffffffffffffd90;
  int in_stack_fffffffffffffd94;
  HighsCDouble local_208;
  double local_1f8;
  int local_1f0;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  HighsCDouble local_1e0;
  HighsCDouble local_1d0;
  HighsInt ***local_1c0;
  HighsPseudocostInitialization *local_1b8;
  int *local_1b0;
  undefined1 local_1a8 [40];
  pointer local_180;
  HighsCDouble local_178;
  double local_168;
  value_type local_160;
  double local_158;
  HighsCDouble local_150;
  double local_140;
  int local_138;
  int local_134;
  HighsCDouble local_130;
  HighsCDouble local_120;
  undefined4 local_110;
  int local_10c;
  pointer local_108;
  HighsDomain *local_100;
  Reason *local_f8;
  int *local_f0;
  HighsBasis *local_e8;
  HighsPseudocostInitialization *local_e0;
  HighsCliqueTable *local_d8;
  HighsImplications *local_d0;
  vector<int,_std::allocator<int>_> local_b8;
  undefined8 local_a0;
  Reason local_98;
  HighsCDouble local_90;
  HighsCDouble local_80;
  pointer local_70;
  int local_64;
  int local_60;
  int local_5c;
  HighsCDouble local_58;
  pointer local_48;
  HighsDomain *local_40;
  HighsImplications *local_38;
  int local_24;
  HighsInt **local_20;
  Reason local_18;
  HighsCDouble *local_10;
  
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  bVar4 = isFull(in_RDI);
  if (!bVar4) {
    pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x536bac);
    local_38 = &pHVar7->implications;
    pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x536bce);
    local_40 = &pHVar7->domain;
    pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x536bf0);
    local_48 = (pointer)pHVar7->feastol;
    HighsCDouble::HighsCDouble(&local_58,0.0);
    local_5c = 0;
    for (local_60 = 0; local_60 != local_24; local_60 = local_60 + 1) {
      bVar4 = HighsDomain::isBinary
                        ((HighsDomain *)in_stack_fffffffffffffaf0._M_current,
                         in_stack_fffffffffffffaec);
      if (bVar4) {
        local_5c = local_5c + 1;
      }
      if ((double)local_20[local_60] <= 0.0) {
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_40->col_upper_,
                            (long)*(int *)((long)local_18 + (long)local_60 * 4));
        if ((*pvVar8 == INFINITY) && (!NAN(*pvVar8))) {
          return;
        }
        std::vector<double,_std::allocator<double>_>::operator[]
                  (&local_40->col_upper_,(long)*(int *)((long)local_18 + (long)local_60 * 4));
        HighsCDouble::operator+=
                  ((HighsCDouble *)in_stack_fffffffffffffb00.vals,(double)in_stack_fffffffffffffaf8)
        ;
      }
      else {
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_40->col_lower_,
                            (long)*(int *)((long)local_18 + (long)local_60 * 4));
        if ((*pvVar8 == -INFINITY) && (!NAN(*pvVar8))) {
          return;
        }
        std::vector<double,_std::allocator<double>_>::operator[]
                  (&local_40->col_lower_,(long)*(int *)((long)local_18 + (long)local_60 * 4));
        HighsCDouble::operator+=
                  ((HighsCDouble *)in_stack_fffffffffffffb00.vals,(double)in_stack_fffffffffffffaf8)
        ;
      }
    }
    for (local_64 = 0; local_64 != local_24; local_64 = local_64 + 1) {
      HVar5 = HighsMipSolver::variableType
                        ((HighsMipSolver *)in_stack_fffffffffffffaf0._M_current,
                         in_stack_fffffffffffffaec);
      if (HVar5 != kContinuous) {
        local_90 = ::operator-((double)in_stack_fffffffffffffb00.vals,in_stack_fffffffffffffaf8);
        local_80 = HighsCDouble::operator/
                             ((HighsCDouble *)
                              CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                              2.7014427510835e-317);
        pdVar15 = (pointer)HighsCDouble::operator_cast_to_double(&local_80);
        local_70 = pdVar15;
        if ((double)local_20[local_64] <= 0.0) {
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_40->col_upper_,
                              (long)*(int *)((long)local_18 + (long)local_64 * 4));
          dVar17 = *pvVar8;
          dVar16 = HighsDomain::feastol((HighsDomain *)0x537037);
          local_70 = (pointer)ceil(((double)pdVar15 + dVar17) - dVar16);
          local_a0 = HighsDomain::Reason::unspecified();
          HighsDomain::changeBound
                    ((HighsDomain *)in_stack_fffffffffffffb08._M_current,
                     (HighsBoundType)((ulong)in_stack_fffffffffffffb00.vals >> 0x20),
                     (HighsInt)in_stack_fffffffffffffb00.vals,(double)in_stack_fffffffffffffaf8,
                     in_stack_fffffffffffffb10);
          bVar4 = HighsDomain::infeasible(local_40);
          if (bVar4) {
            return;
          }
        }
        else {
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_40->col_lower_,
                              (long)*(int *)((long)local_18 + (long)local_64 * 4));
          dVar17 = *pvVar8;
          dVar16 = HighsDomain::feastol((HighsDomain *)0x536f2c);
          local_70 = (pointer)floor((double)pdVar15 + dVar17 + dVar16);
          local_98 = HighsDomain::Reason::unspecified();
          HighsDomain::changeBound
                    ((HighsDomain *)in_stack_fffffffffffffb08._M_current,
                     (HighsBoundType)((ulong)in_stack_fffffffffffffb00.vals >> 0x20),
                     (HighsInt)in_stack_fffffffffffffb00.vals,(double)in_stack_fffffffffffffaf8,
                     in_stack_fffffffffffffb10);
          bVar4 = HighsDomain::infeasible(local_40);
          if (bVar4) {
            return;
          }
        }
      }
    }
    if (1 < local_5c) {
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x53711b);
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb10,
                 (size_type)in_stack_fffffffffffffb08._M_current);
      local_d0 = (HighsImplications *)
                 std::vector<int,_std::allocator<int>_>::begin
                           ((vector<int,_std::allocator<int>_> *)
                            CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
      local_d8 = (HighsCliqueTable *)
                 std::vector<int,_std::allocator<int>_>::end
                           ((vector<int,_std::allocator<int>_> *)
                            CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
      _Var19._M_current._4_4_ = in_stack_fffffffffffffaec;
      _Var19._M_current._0_4_ = in_stack_fffffffffffffae8;
      std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                (in_stack_fffffffffffffaf0,_Var19,0);
      local_e8 = (HighsBasis *)
                 std::vector<int,_std::allocator<int>_>::begin
                           ((vector<int,_std::allocator<int>_> *)
                            CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
      local_f0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                  ((vector<int,_std::allocator<int>_> *)
                                   CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
      local_100 = local_40;
      local_f8 = &local_18;
      __pred.inds = in_stack_fffffffffffffb18;
      __pred.globaldom = (HighsDomain *)in_stack_fffffffffffffb10;
      local_e0 = (HighsPseudocostInitialization *)
                 std::
                 partition<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCliqueTable::extractCliquesFromCut(HighsMipSolver_const&,int_const*,double_const*,int,double)::__0>
                           (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,__pred);
      local_108 = (pointer)std::vector<int,_std::allocator<int>_>::begin
                                     ((vector<int,_std::allocator<int>_> *)
                                      CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8))
      ;
      dVar9 = __gnu_cxx::operator-
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffffaf0._M_current,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
      HVar18.lo = local_120.lo;
      HVar18.hi = local_120.hi;
      local_5c = (int)dVar9;
      if (local_5c < local_24) {
        for (local_10c = 0; RVar3 = local_18, local_10c != local_5c; local_10c = local_10c + 1) {
          local_120 = HVar18;
          pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&local_b8,(long)local_10c);
          local_110 = *(undefined4 *)((long)RVar3 + (long)*pvVar10 * 4);
          HVar18 = ::operator-((double)in_stack_fffffffffffffb00.vals,in_stack_fffffffffffffaf8);
          pvVar14 = &local_b8;
          local_130 = HVar18;
          std::vector<int,_std::allocator<int>_>::operator[](pvVar14,(long)local_10c);
          std::abs((int)pvVar14);
          HVar18 = HighsCDouble::operator-
                             ((HighsCDouble *)in_stack_fffffffffffffaf0._M_current,
                              (double)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8))
          ;
          for (local_134 = local_5c; RVar3 = local_18, local_134 != local_24;
              local_134 = local_134 + 1) {
            local_120 = HVar18;
            pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&local_b8,(long)local_134);
            local_138 = *(int *)((long)RVar3 + (long)*pvVar10 * 4);
            bVar4 = HighsDomain::isFixed
                              ((HighsDomain *)in_stack_fffffffffffffb00.vals,
                               (HighsInt)((ulong)in_stack_fffffffffffffaf8 >> 0x20));
            ppHVar2 = local_20;
            HVar18 = local_120;
            if (!bVar4) {
              pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                  (&local_b8,(long)local_134);
              if ((double)ppHVar2[*pvVar10] <= 0.0) {
                std::vector<int,_std::allocator<int>_>::operator[](&local_b8,(long)local_134);
                std::vector<double,_std::allocator<double>_>::operator[]
                          (&local_40->col_upper_,(long)local_138);
                HVar18 = HighsCDouble::operator+
                                   ((HighsCDouble *)in_stack_fffffffffffffaf0._M_current,
                                    (double)CONCAT44(in_stack_fffffffffffffaec,
                                                     in_stack_fffffffffffffae8));
                local_178 = HVar18;
                dVar17 = HighsCDouble::operator_cast_to_double(&local_178);
                ppHVar2 = local_20;
                pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                    (&local_b8,(long)local_134);
                local_168 = dVar17 / (double)ppHVar2[*pvVar10];
                HVar5 = HighsMipSolver::variableType
                                  ((HighsMipSolver *)in_stack_fffffffffffffaf0._M_current,
                                   in_stack_fffffffffffffaec);
                dVar17 = local_168;
                if (HVar5 != kContinuous) {
                  pHVar7 = std::
                           unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           ::operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                         *)0x537918);
                  local_168 = ceil(dVar17 - pHVar7->feastol);
                }
                dVar17 = local_168;
                pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (&local_40->col_lower_,(long)local_138);
                ppHVar2 = local_20;
                HVar18 = local_120;
                if (*pvVar8 + (double)local_48 < dVar17) {
                  pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                      (&local_b8,(long)local_10c);
                  if (0.0 < (double)ppHVar2[*pvVar10] || (double)ppHVar2[*pvVar10] == 0.0) {
                    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                       (&local_40->col_lower_,(long)local_138);
                    dVar17 = local_168;
                    if ((*pvVar8 == -INFINITY) && (HVar18 = local_120, !NAN(*pvVar8)))
                    goto LAB_00537ae2;
                    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                       (&local_40->col_lower_,(long)local_138);
                    local_180 = (pointer)(dVar17 - *pvVar8);
                    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                       (&local_40->col_lower_,(long)local_138);
                    local_1a8._32_8_ = *pvVar8;
                  }
                  else {
                    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                       (&local_40->col_lower_,(long)local_138);
                    local_180 = (pointer)(*pvVar8 - local_168);
                    local_1a8._32_8_ = local_168;
                  }
                  HighsImplications::addVLB
                            (in_stack_fffffffffffffb70,
                             (HighsInt)((ulong)in_stack_fffffffffffffb68 >> 0x20),
                             (HighsInt)in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,
                             in_stack_fffffffffffffb58);
                  HVar18 = local_120;
                }
              }
              else {
                std::vector<int,_std::allocator<int>_>::operator[](&local_b8,(long)local_134);
                std::vector<double,_std::allocator<double>_>::operator[]
                          (&local_40->col_lower_,(long)local_138);
                HVar18 = HighsCDouble::operator+
                                   ((HighsCDouble *)in_stack_fffffffffffffaf0._M_current,
                                    (double)CONCAT44(in_stack_fffffffffffffaec,
                                                     in_stack_fffffffffffffae8));
                local_150 = HVar18;
                dVar17 = HighsCDouble::operator_cast_to_double(&local_150);
                ppHVar2 = local_20;
                pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                    (&local_b8,(long)local_134);
                local_140 = dVar17 / (double)ppHVar2[*pvVar10];
                HVar5 = HighsMipSolver::variableType
                                  ((HighsMipSolver *)in_stack_fffffffffffffaf0._M_current,
                                   in_stack_fffffffffffffaec);
                dVar17 = local_140;
                if (HVar5 != kContinuous) {
                  pHVar7 = std::
                           unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           ::operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                         *)0x5375e6);
                  local_140 = floor(dVar17 + pHVar7->feastol);
                }
                dVar17 = local_140;
                pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (&local_40->col_upper_,(long)local_138);
                ppHVar2 = local_20;
                HVar18 = local_120;
                if (dVar17 < *pvVar8 - (double)local_48) {
                  pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                      (&local_b8,(long)local_10c);
                  if (0.0 < (double)ppHVar2[*pvVar10] || (double)ppHVar2[*pvVar10] == 0.0) {
                    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                       (&local_40->col_upper_,(long)local_138);
                    dVar17 = local_140;
                    if ((*pvVar8 == INFINITY) && (HVar18 = local_120, !NAN(*pvVar8)))
                    goto LAB_00537ae2;
                    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                       (&local_40->col_upper_,(long)local_138);
                    local_158 = dVar17 - *pvVar8;
                    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                       (&local_40->col_upper_,(long)local_138);
                    local_160 = *pvVar8;
                  }
                  else {
                    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                       (&local_40->col_upper_,(long)local_138);
                    local_158 = *pvVar8 - local_140;
                    local_160 = local_140;
                  }
                  HighsImplications::addVUB
                            (in_stack_fffffffffffffb70,
                             (HighsInt)((ulong)in_stack_fffffffffffffb68 >> 0x20),
                             (HighsInt)in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,
                             in_stack_fffffffffffffb58);
                  HVar18 = local_120;
                }
              }
            }
LAB_00537ae2:
          }
        }
      }
      local_120 = HVar18;
      if (local_5c < 2) {
        local_1a8._28_4_ = 1;
      }
      else {
        std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
        vector((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *)
               0x537b41);
        std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
        reserve((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *
                )in_stack_fffffffffffffb20._M_current,(size_type)in_stack_fffffffffffffb18);
        local_1b0 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                     ((vector<int,_std::allocator<int>_> *)
                                      CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8))
        ;
        local_1b8 = local_e0;
        local_1c0 = &local_20;
        pdqsort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCliqueTable::extractCliquesFromCut(HighsMipSolver_const&,int_const*,double_const*,int,double)::__1>
                  ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
        pvVar14 = &local_b8;
        std::vector<int,_std::allocator<int>_>::operator[](pvVar14,0);
        std::abs((int)pvVar14);
        pvVar14 = &local_b8;
        std::vector<int,_std::allocator<int>_>::operator[](pvVar14,1);
        std::abs((int)pvVar14);
        local_1e0 = ::operator-((double)in_stack_fffffffffffffb00.vals,in_stack_fffffffffffffaf8);
        local_1d0 = HighsCDouble::operator+
                              ((HighsCDouble *)in_stack_fffffffffffffaf0._M_current,
                               (double)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8)
                              );
        dVar17 = HighsCDouble::operator_cast_to_double(&local_1d0);
        if (dVar17 < extraout_XMM0_Qa + extraout_XMM0_Qa_00) {
          pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                   operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                               *)0x537d6a);
          iVar1 = pHVar7->numCliqueEntriesAfterPresolve;
          HVar6 = HighsDomain::numModelNonzeros((HighsDomain *)0x537d89);
          local_1e8 = iVar1 + 100000 + HVar6 * 4;
          local_1ec = in_RDI->numEntries + local_5c * 10;
          piVar11 = std::min<int>(&local_1e8,&local_1ec);
          local_1e4 = *piVar11;
          local_1f0 = local_5c;
          do {
            do {
              local_1f0 = local_1f0 + -1;
              bVar4 = false;
              if (local_1f0 != 0) {
                bVar4 = in_RDI->numEntries < local_1e4;
              }
              if (!bVar4) {
                local_1a8._28_4_ = 0;
                goto LAB_00538360;
              }
              ::operator-((double)in_stack_fffffffffffffb00.vals,in_stack_fffffffffffffaf8);
              pvVar14 = &local_b8;
              std::vector<int,_std::allocator<int>_>::operator[](pvVar14,(long)local_1f0);
              std::abs((int)pvVar14);
              HighsCDouble::operator-
                        ((HighsCDouble *)in_stack_fffffffffffffaf0._M_current,
                         (double)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
              HVar18 = HighsCDouble::operator+
                                 ((HighsCDouble *)in_stack_fffffffffffffaf0._M_current,
                                  (double)CONCAT44(in_stack_fffffffffffffaec,
                                                   in_stack_fffffffffffffae8));
              local_208 = HVar18;
              local_1f8 = HighsCDouble::operator_cast_to_double(&local_208);
              _Var19._M_current = (int *)&local_b8;
              std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
              std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
              __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator+((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                        in_stack_fffffffffffffaf8,
                        (difference_type)in_stack_fffffffffffffaf0._M_current);
              __pred_00.mincliqueval = (double *)in_stack_fffffffffffffb18;
              __pred_00.vals = (double **)in_stack_fffffffffffffb10;
              in_stack_fffffffffffffb28 =
                   std::
                   partition_point<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCliqueTable::extractCliquesFromCut(HighsMipSolver_const&,int_const*,double_const*,int,double)::__2>
                             (in_stack_fffffffffffffb28,_Var19,__pred_00);
              this_00 = std::vector<int,_std::allocator<int>_>::begin
                                  ((vector<int,_std::allocator<int>_> *)
                                   CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
              bVar4 = __gnu_cxx::operator==
                                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)in_stack_fffffffffffffaf0._M_current,
                                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
            } while (bVar4);
            std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
            clear((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   *)0x53806f);
            mipsolver_00 = std::vector<int,_std::allocator<int>_>::begin
                                     ((vector<int,_std::allocator<int>_> *)
                                      CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8))
            ;
            while( true ) {
              bVar4 = __gnu_cxx::operator!=
                                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)in_stack_fffffffffffffaf0._M_current,
                                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
              if (!bVar4) break;
              piVar12 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)&stack0xfffffffffffffd98);
              in_stack_fffffffffffffd94 = *piVar12;
              if (0.0 < (double)local_20[in_stack_fffffffffffffd94] ||
                  (double)local_20[in_stack_fffffffffffffd94] == 0.0) {
                in_stack_fffffffffffffd8c = 1;
                std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                ::emplace_back<int_const&,int>
                          ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                            *)in_stack_fffffffffffffb00.vals,(int *)in_stack_fffffffffffffaf8,
                           in_stack_fffffffffffffaf0._M_current);
              }
              else {
                in_stack_fffffffffffffd90 = 0;
                std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                ::emplace_back<int_const&,int>
                          ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                            *)in_stack_fffffffffffffb00.vals,(int *)in_stack_fffffffffffffaf8,
                           in_stack_fffffffffffffaf0._M_current);
              }
              __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator++((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         &stack0xfffffffffffffd98);
            }
            in_stack_fffffffffffffb18 = local_20;
            pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&local_b8,(long)local_1f0);
            if (0.0 < (double)in_stack_fffffffffffffb18[*pvVar10] ||
                (double)in_stack_fffffffffffffb18[*pvVar10] == 0.0) {
              std::vector<int,_std::allocator<int>_>::operator[](&local_b8,(long)local_1f0);
              in_stack_fffffffffffffd84 = 1;
              std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
              emplace_back<int_const&,int>
                        ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                          *)in_stack_fffffffffffffb00.vals,(int *)in_stack_fffffffffffffaf8,
                         in_stack_fffffffffffffaf0._M_current);
            }
            else {
              in_stack_fffffffffffffb10 = local_18;
              std::vector<int,_std::allocator<int>_>::operator[](&local_b8,(long)local_1f0);
              in_stack_fffffffffffffd88 = 0;
              std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
              emplace_back<int_const&,int>
                        ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                          *)in_stack_fffffffffffffb00.vals,(int *)in_stack_fffffffffffffaf8,
                         in_stack_fffffffffffffaf0._M_current);
            }
            sVar13 = std::
                     vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     ::size((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                             *)local_1a8);
            if (1 < sVar13) {
              in_stack_fffffffffffffaf0._M_current = (int *)local_1a8;
              in_stack_fffffffffffffaf8 = local_10;
              in_stack_fffffffffffffb00.vals =
                   (double **)
                   std::
                   vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   ::data((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                           *)0x53826d);
              std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              ::size((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      *)in_stack_fffffffffffffaf0._M_current);
              addClique((HighsCliqueTable *)this_00._M_current,
                        (HighsMipSolver *)mipsolver_00._M_current,
                        (CliqueVar *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                        in_stack_fffffffffffffd8c,SUB41((uint)in_stack_fffffffffffffd88 >> 0x18,0),
                        in_stack_fffffffffffffd84);
              bVar4 = HighsDomain::infeasible(local_40);
              in_stack_fffffffffffffaec = CONCAT13(bVar4,(int3)in_stack_fffffffffffffaec);
              if ((bVar4) || (local_1e4 <= in_RDI->numEntries)) {
                local_1a8._28_4_ = 1;
                goto LAB_00538360;
              }
            }
            std::vector<int,_std::allocator<int>_>::begin
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffaf8,
                       (difference_type)in_stack_fffffffffffffaf0._M_current);
            bVar4 = __gnu_cxx::operator==
                              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               in_stack_fffffffffffffaf0._M_current,
                               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
          } while (!bVar4);
          local_1a8._28_4_ = 1;
        }
        else {
          local_1a8._28_4_ = 1;
        }
LAB_00538360:
        std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
        ~vector((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *
                )in_stack_fffffffffffffb00.vals);
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb00.vals);
    }
  }
  return;
}

Assistant:

void HighsCliqueTable::extractCliquesFromCut(const HighsMipSolver& mipsolver,
                                             const HighsInt* inds,
                                             const double* vals, HighsInt len,
                                             double rhs) {
  if (isFull()) return;

  HighsImplications& implics = mipsolver.mipdata_->implications;
  HighsDomain& globaldom = mipsolver.mipdata_->domain;

  const double feastol = mipsolver.mipdata_->feastol;

  HighsCDouble minact = 0.0;
  HighsInt nbin = 0;
  for (HighsInt i = 0; i != len; ++i) {
    if (globaldom.isBinary(inds[i])) ++nbin;

    if (vals[i] > 0) {
      if (globaldom.col_lower_[inds[i]] == -kHighsInf) return;
      minact += vals[i] * globaldom.col_lower_[inds[i]];
    } else {
      if (globaldom.col_upper_[inds[i]] == kHighsInf) return;
      minact += vals[i] * globaldom.col_upper_[inds[i]];
    }
  }

  for (HighsInt i = 0; i != len; ++i) {
    if (mipsolver.variableType(inds[i]) == HighsVarType::kContinuous) continue;

    double boundVal = double((rhs - minact) / vals[i]);
    if (vals[i] > 0) {
      boundVal = std::floor(boundVal + globaldom.col_lower_[inds[i]] +
                            globaldom.feastol());
      globaldom.changeBound(HighsBoundType::kUpper, inds[i], boundVal,
                            HighsDomain::Reason::unspecified());
      if (globaldom.infeasible()) return;
    } else {
      boundVal = std::ceil(boundVal + globaldom.col_upper_[inds[i]] -
                           globaldom.feastol());
      globaldom.changeBound(HighsBoundType::kLower, inds[i], boundVal,
                            HighsDomain::Reason::unspecified());
      if (globaldom.infeasible()) return;
    }
  }

  if (nbin <= 1) return;

  std::vector<HighsInt> perm;
  perm.resize(len);
  std::iota(perm.begin(), perm.end(), 0);

  auto binaryend = std::partition(perm.begin(), perm.end(), [&](HighsInt pos) {
    return globaldom.isBinary(inds[pos]);
  });

  nbin = binaryend - perm.begin();

  // if not all variables are binary, we extract variable upper and lower bounds
  // constraints on the non-binary variable for each binary variable in the
  // constraint:
  if (nbin < len) {
    for (HighsInt i = 0; i != nbin; ++i) {
      HighsInt bincol = inds[perm[i]];
      HighsCDouble impliedActivity = rhs - minact - std::abs(vals[perm[i]]);
      for (HighsInt j = nbin; j != len; ++j) {
        HighsInt col = inds[perm[j]];
        if (globaldom.isFixed(col)) continue;

        if (vals[perm[j]] > 0) {
          double implcolub = double(impliedActivity +
                                    vals[perm[j]] * globaldom.col_lower_[col]) /
                             vals[perm[j]];
          if (mipsolver.variableType(col) != HighsVarType::kContinuous)
            implcolub = std::floor(implcolub + mipsolver.mipdata_->feastol);

          if (implcolub < globaldom.col_upper_[col] - feastol) {
            double coef;
            double constant;
            if (vals[perm[i]] < 0) {
              coef = globaldom.col_upper_[col] - implcolub;
              constant = implcolub;
            } else {
              // make sure that upper bound is not infinite to avoid adding VUB
              // with coefficient '-kHighsInf' and constant 'kHighsInf'
              if (globaldom.col_upper_[col] == kHighsInf) continue;
              coef = implcolub - globaldom.col_upper_[col];
              constant = globaldom.col_upper_[col];
            }
            // printf("extracted VUB from cut: x%" HIGHSINT_FORMAT " <= %g*y%"
            // HIGHSINT_FORMAT " + %g\n", col, coef,
            //        bincol, constant);
            implics.addVUB(col, bincol, coef, constant);
          }
        } else {
          double implcollb = double(impliedActivity +
                                    vals[perm[j]] * globaldom.col_upper_[col]) /
                             vals[perm[j]];
          if (mipsolver.variableType(col) != HighsVarType::kContinuous)
            implcollb = std::ceil(implcollb - mipsolver.mipdata_->feastol);

          if (implcollb > globaldom.col_lower_[col] + feastol) {
            double coef;
            double constant;
            if (vals[perm[i]] < 0) {
              coef = globaldom.col_lower_[col] - implcollb;
              constant = implcollb;
            } else {
              // make sure that lower bound is not infinite to avoid adding VLB
              // with coefficient 'kHighsInf' and constant '-kHighsInf'
              if (globaldom.col_lower_[col] == -kHighsInf) continue;
              coef = implcollb - globaldom.col_lower_[col];
              constant = globaldom.col_lower_[col];
            }

            // printf("extracted VLB from cut: x%" HIGHSINT_FORMAT " >= %g*y%"
            // HIGHSINT_FORMAT " + %g\n", col, coef,
            //        bincol, constant);
            implics.addVLB(col, bincol, coef, constant);
            // printf("extracted VLB from cut\n");
          }
        }
      }
    }
  }

  // only one binary means we do have no cliques
  if (nbin <= 1) return;

  std::vector<CliqueVar> clique;
  clique.reserve(nbin);

  pdqsort(perm.begin(), binaryend, [&](HighsInt p1, HighsInt p2) {
    return std::make_pair(std::abs(vals[p1]), p1) >
           std::make_pair(std::abs(vals[p2]), p2);
  });
  // check if any cliques exists
  if (std::abs(vals[perm[0]]) + std::abs(vals[perm[1]]) <=
      double(rhs - minact + feastol))
    return;

  HighsInt maxNewEntries =
      std::min(mipsolver.mipdata_->numCliqueEntriesAfterPresolve + 100000 +
                   4 * globaldom.numModelNonzeros(),
               numEntries + 10 * nbin);

  for (HighsInt k = nbin - 1; k != 0 && numEntries < maxNewEntries; --k) {
    double mincliqueval =
        double(rhs - minact - std::abs(vals[perm[k]]) + feastol);
    auto cliqueend = std::partition_point(
        perm.begin(), perm.begin() + k,
        [&](HighsInt p) { return std::abs(vals[p]) > mincliqueval; });

    // no clique for this variable
    if (cliqueend == perm.begin()) continue;

    clique.clear();

    for (auto j = perm.begin(); j != cliqueend; ++j) {
      HighsInt pos = *j;
      if (vals[pos] < 0)
        clique.emplace_back(inds[pos], 0);
      else
        clique.emplace_back(inds[pos], 1);
    }

    if (vals[perm[k]] < 0)
      clique.emplace_back(inds[perm[k]], 0);
    else
      clique.emplace_back(inds[perm[k]], 1);

    // printf("extracted this clique:\n");
    // printClique(clique);
    if (clique.size() >= 2) {
      // printf("extracted clique from cut\n");
      // if (clique.size() > 2) runCliqueSubsumption(globaldom, clique);

      addClique(mipsolver, clique.data(), clique.size());
      if (globaldom.infeasible() || numEntries >= maxNewEntries) return;
    }

    // further cliques are just subsets of this clique
    if (cliqueend == perm.begin() + k) return;
  }
}